

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void sync_c0_tcstatus(CPUMIPSState_conflict5 *cpu,int tc,target_ulong v)

{
  uint32_t mask;
  uint32_t tksu;
  uint32_t tasid;
  uint32_t tmx;
  uint32_t tcu;
  uint32_t status;
  target_ulong v_local;
  int tc_local;
  CPUMIPSState_conflict5 *cpu_local;
  
  cpu->CP0_Status = cpu->CP0_Status & 0xeffffe7;
  cpu->CP0_Status =
       ((uint)(v >> 0xb) & 3) << 3 | ((uint)(v >> 0x1b) & 1) << 0x18 | (int)(v >> 0x1c) << 0x1c |
       cpu->CP0_Status;
  cpu->CP0_EntryHi = (cpu->CP0_EntryHi_ASID_mask ^ 0xffffffffffffffff) & cpu->CP0_EntryHi;
  cpu->CP0_EntryHi = (ulong)((uint)v & (uint)cpu->CP0_EntryHi_ASID_mask) | cpu->CP0_EntryHi;
  compute_hflags(cpu);
  return;
}

Assistant:

static void sync_c0_tcstatus(CPUMIPSState *cpu, int tc,
                             target_ulong v)
{
    uint32_t status;
    uint32_t tcu, tmx, tasid, tksu;
    uint32_t mask = ((1U << CP0St_CU3)
                       | (1 << CP0St_CU2)
                       | (1 << CP0St_CU1)
                       | (1 << CP0St_CU0)
                       | (1 << CP0St_MX)
                       | (3 << CP0St_KSU));

    tcu = (v >> CP0TCSt_TCU0) & 0xf;
    tmx = (v >> CP0TCSt_TMX) & 0x1;
    tasid = v & cpu->CP0_EntryHi_ASID_mask;
    tksu = (v >> CP0TCSt_TKSU) & 0x3;

    status = tcu << CP0St_CU0;
    status |= tmx << CP0St_MX;
    status |= tksu << CP0St_KSU;

    cpu->CP0_Status &= ~mask;
    cpu->CP0_Status |= status;

    /* Sync the TASID with EntryHi.  */
    cpu->CP0_EntryHi &= ~cpu->CP0_EntryHi_ASID_mask;
    cpu->CP0_EntryHi |= tasid;

    compute_hflags(cpu);
}